

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::testDrawArray(GLSLTestBase *this,bool use_version_400)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  program *this_00;
  vertexArray vao;
  framebuffer framebuffer;
  texture source_tex;
  texture color_tex;
  program program;
  buffer vertex_buffer;
  shaderSource tess_eval_data;
  shaderSource tess_ctrl_data;
  shaderSource geometry_data;
  shaderSource vertex_data;
  shaderSource fragment_data;
  MessageBuilder message;
  
  vao.m_context = (this->super_TestBase).super_TestCase.m_context;
  color_tex.m_id = 0;
  framebuffer.m_id = 0;
  source_tex.m_texture_type = TEX_2D;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  source_tex.m_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  vao.m_id = 0;
  vertex_buffer.m_id = 0;
  vertex_buffer.m_target = 0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fragment_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  geometry_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_ctrl_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_eval_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertex_data.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  framebuffer.m_context = vao.m_context;
  source_tex.m_context = vao.m_context;
  color_tex.m_context = vao.m_context;
  color_tex.m_texture_type = source_tex.m_texture_type;
  program.m_context = vao.m_context;
  vertex_buffer.m_context = vao.m_context;
  TestBase::initShaderSource(&this->super_TestBase,FRAGMENT_SHADER,use_version_400,&fragment_data);
  TestBase::initShaderSource(&this->super_TestBase,GEOMETRY_SHADER,use_version_400,&geometry_data);
  TestBase::initShaderSource(&this->super_TestBase,TESS_CTRL_SHADER,use_version_400,&tess_ctrl_data)
  ;
  TestBase::initShaderSource(&this->super_TestBase,TESS_EVAL_SHADER,use_version_400,&tess_eval_data)
  ;
  TestBase::initShaderSource(&this->super_TestBase,VERTEX_SHADER,use_version_400,&vertex_data);
  message.m_log = (TestLog *)0x0;
  message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  Utils::program::build
            (&program,(shaderSource *)&message,&fragment_data,&geometry_data,&tess_ctrl_data,
             &tess_eval_data,&vertex_data,(GLchar **)0x0,0,false);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             *)&message);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,&program,&vertex_buffer,&vao);
  this_00 = &program;
  Utils::program::use(this_00);
  prepareFramebuffer((GLSLTestBase *)this_00,&framebuffer,&color_tex);
  iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xc])
                    (this,&source_tex);
  if ((GLchar *)CONCAT44(extraout_var,iVar2) != (GLchar *)0x0) {
    bindTextureToSampler(this,&program,&source_tex,(GLchar *)CONCAT44(extraout_var,iVar2));
  }
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,&program);
  iVar2 = (*((this->super_TestBase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x538))(0xe,0,1);
  err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(err,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x898);
  bVar1 = checkResults(this,&color_tex);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])(this);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&vertex_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&tess_eval_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&tess_ctrl_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&geometry_data.m_parts);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&fragment_data.m_parts);
  Utils::buffer::~buffer(&vertex_buffer);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::texture::~texture(&source_tex);
  Utils::program::~program(&program);
  Utils::framebuffer::~framebuffer(&framebuffer);
  Utils::texture::~texture(&color_tex);
  return bVar1;
}

Assistant:

bool GLSLTestBase::testDrawArray(bool use_version_400)
{
	/* Test Result */
	bool result = true;

	/* GL objects */
	Utils::texture	 color_tex(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 source_tex(m_context);
	Utils::vertexArray vao(m_context);
	Utils::buffer	  vertex_buffer(m_context);

	/* Shaders */
	Utils::shaderSource fragment_data;
	Utils::shaderSource geometry_data;
	Utils::shaderSource tess_ctrl_data;
	Utils::shaderSource tess_eval_data;
	Utils::shaderSource vertex_data;

	initShaderSource(Utils::FRAGMENT_SHADER, use_version_400, fragment_data);
	initShaderSource(Utils::GEOMETRY_SHADER, use_version_400, geometry_data);
	initShaderSource(Utils::TESS_CTRL_SHADER, use_version_400, tess_ctrl_data);
	initShaderSource(Utils::TESS_EVAL_SHADER, use_version_400, tess_eval_data);
	initShaderSource(Utils::VERTEX_SHADER, use_version_400, vertex_data);

	/* Build program */
	try
	{
		program.build(0 /* compute shader */, fragment_data, geometry_data, tess_ctrl_data, tess_eval_data, vertex_data,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

/* Log shaders, for debugging */
#if IS_DEBUG
	{
		const Utils::shaderSource* data[] = { &vertex_data, &tess_ctrl_data, &tess_eval_data, &geometry_data,
											  &fragment_data };

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		for (GLuint i = 0; i < 5; ++i)
		{
			Utils::program::printShaderSource(*data[i], message);
		}

		message << tcu::TestLog::EndMessage;
	}
#endif /* IS_DEBUG */

	/* Test specific preparation of vertex buffer and vao*/
	prepareVertexBuffer(program, vertex_buffer, vao);

	/* Set current program */
	program.use();

	/* Prepare framebuffer */
	prepareFramebuffer(framebuffer, color_tex);

	/* Test specific preparation of source texture */
	const GLchar* sampler_name = prepareSourceTexture(source_tex);
	if (0 != sampler_name)
	{
		bindTextureToSampler(program, source_tex, sampler_name);
	}

	/* Set up uniforms */
	prepareUniforms(program);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Draw */
	gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Return result of verification */
	result = checkResults(color_tex);

	/* Release extra resource for the test */
	releaseResource();

	return result;
}